

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
::BinaryArgReader(BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::LogicalExprReader>
                  *this,NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *r)

{
  NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::ReadLogicalExpr_abi_cxx11_
            (&this->lhs,(NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *)r);
  NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::ReadLogicalExpr_abi_cxx11_
            (&this->rhs,(NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter> *)r);
  return;
}

Assistant:

BinaryArgReader(NLReader &r)
      : lhs(ExprReader().Read(r)), rhs(ExprReader().Read(r)) {}